

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_cpp_add_bulk(void **param_1)

{
  uint32_t x;
  bool bVar1;
  pointer puVar2;
  initializer_list<unsigned_int> __l;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  Roaring r1;
  BulkContext bulk_context;
  Roaring r2;
  
  r1.roaring.high_low_container.size = 9999;
  r1.roaring.high_low_container.allocation_size = 0x7b;
  r1.roaring.high_low_container.containers = (container_s **)0xfffffff7ffffffff;
  r1.roaring.high_low_container.keys._0_4_ = 9999;
  __l._M_len = 5;
  __l._M_array = (iterator)&r1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&values,__l,(allocator_type *)&r2);
  roaring::Roaring::Roaring(&r1);
  roaring::Roaring::Roaring(&r2);
  bulk_context.context_.idx = 0;
  bulk_context.context_.key = 0;
  bulk_context.context_.typecode = '\0';
  bulk_context.context_.container._0_7_ = 0;
  bulk_context.context_.container._7_1_ = 0;
  for (puVar2 = values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar2 != values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
    x = *puVar2;
    roaring::Roaring::addBulk(&r1,&bulk_context,x);
    roaring::Roaring::add(&r2,x);
    bVar1 = roaring::Roaring::operator==(&r1,&r2);
    _assert_true((ulong)bVar1,"r1 == r2",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
                 ,0x2f8);
  }
  roaring::Roaring::~Roaring(&r2);
  roaring::Roaring::~Roaring(&r1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&values.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_bulk) {
    std::vector<uint32_t> values = {9999, 123, 0xFFFFFFFF, 0xFFFFFFF7, 9999};
    Roaring r1;
    Roaring r2;
    roaring::BulkContext bulk_context;
    for (const auto value : values) {
        r1.addBulk(bulk_context, value);
        r2.add(value);
        assert_true(r1 == r2);
    }
}